

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O0

void __thiscall DSDcc::DSDDstar::processVoice(DSDDstar *this)

{
  int iVar1;
  DSDLogger *this_00;
  byte bVar2;
  DSDDstar *in_RDI;
  double __x;
  uchar bit;
  undefined7 in_stack_fffffffffffffff0;
  
  iVar1 = DSDSymbol::getDibit((DSDSymbol *)0x124511);
  bVar2 = (byte)iVar1;
  if (in_RDI->m_symbolIndex == 0) {
    initVoiceFrame((DSDDstar *)CONCAT17(bVar2,in_stack_fffffffffffffff0));
  }
  in_RDI->m_dsdDecoder->ambe_fr[*in_RDI->w][*in_RDI->x] = bVar2 & 1;
  in_RDI->w = in_RDI->w + 1;
  in_RDI->x = in_RDI->x + 1;
  storeSymbolDV(in_RDI,in_RDI->m_symbolIndex,bVar2 & 1,true);
  if (in_RDI->m_symbolIndex == 0x47) {
    if ((in_RDI->m_dsdDecoder->m_opts).errorbars == 1) {
      this_00 = DSDDecoder::getLogger(in_RDI->m_dsdDecoder);
      DSDLogger::log(this_00,__x);
    }
    DSDMBEDecoder::processFrame
              (&in_RDI->m_dsdDecoder->m_mbeDecoder1,(char (*) [23])0x0,in_RDI->m_dsdDecoder->ambe_fr
               ,(char (*) [24])0x0);
    in_RDI->m_dsdDecoder->m_mbeDVReady1 = true;
    in_RDI->m_symbolIndex = 0;
    if (in_RDI->m_voiceFrameCount < 0x14) {
      in_RDI->m_frameType = DStarDataFrame;
      in_RDI->m_voiceFrameCount = in_RDI->m_voiceFrameCount + 1;
    }
    else {
      in_RDI->m_frameType = DStarSyncFrame;
    }
  }
  else {
    in_RDI->m_symbolIndex = in_RDI->m_symbolIndex + 1;
  }
  return;
}

Assistant:

void DSDDstar::processVoice()
{
    unsigned char bit = m_dsdDecoder->m_dsdSymbol.getDibit(); // get bit from symbol and store it in cache

    if (m_symbolIndex == 0) {
        initVoiceFrame();
    }

    m_dsdDecoder->ambe_fr[*w][*x] = (1 & bit);
    w++;
    x++;

    storeSymbolDV(m_symbolIndex, (1 & bit)); // store bits in order in DVSI frame

    if (m_symbolIndex == 72-1)
    {
//        std::cerr << "DSDDstar::processVoice: " << m_voiceFrameCount << std::endl;

        if (m_dsdDecoder->m_opts.errorbars == 1) {
            m_dsdDecoder->getLogger().log("\nMBE: ");
        }

        m_dsdDecoder->m_mbeDecoder1.processFrame(0, m_dsdDecoder->ambe_fr, 0);
        m_dsdDecoder->m_mbeDVReady1 = true; // Indicate that a DVSI frame is available

        m_symbolIndex = 0;

        if (m_voiceFrameCount < 20)
        {
            m_frameType = DStarDataFrame;
            m_voiceFrameCount++;
        }
        else
        {
            m_frameType = DStarSyncFrame;
        }
    }
    else
    {
        m_symbolIndex++;
    }
}